

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O3

void __thiscall hwnet::TCPSocket::checkTimeout(TCPSocket *this,Ptr *t)

{
  SendTimeoutCallback *__x;
  RecvTimeoutCallback *__x_00;
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Manager_type p_Var3;
  _Atomic_word _Var4;
  long lVar5;
  undefined8 uVar6;
  _Manager_operation extraout_EDX;
  _Manager_operation extraout_EDX_00;
  element_type *peVar7;
  bool bVar8;
  undefined1 local_60 [8];
  SendTimeoutCallback cb;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  this_00 = (this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_001152a9:
    if ((t->super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (element_type *)0x0) {
      return;
    }
  }
  else {
    _Var4 = this_00->_M_use_count;
    do {
      if (_Var4 == 0) goto LAB_001152a9;
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar8 = _Var4 == iVar1;
      if (bVar8) {
        this_00->_M_use_count = _Var4 + 1;
        iVar1 = _Var4;
      }
      _Var4 = iVar1;
      UNLOCK();
    } while (!bVar8);
    if (this_00->_M_use_count == 0) {
      peVar7 = (element_type *)0x0;
    }
    else {
      peVar7 = (this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
    }
    peVar2 = (t->super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (peVar2 != peVar7) {
      return;
    }
  }
  if ((((((this->closed)._M_base._M_i & 1U) == 0) && (this->sendTimeout != 0)) &&
      ((this->sendTimeoutCallback_).super__Function_base._M_manager != (_Manager_type)0x0)) &&
     ((this->ptrSendlist->head != (sendContext *)0x0 &&
      (lVar5 = std::chrono::_V2::steady_clock::now(),
      this->sendTimeout * 1000000 < (ulong)(lVar5 - (this->lastSendTime).__d.__r))))) {
    __x = &this->sendTimeoutCallback_;
    std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::function
              ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)local_60,__x);
    this->sendTimeout = 0;
    p_Var3 = (this->sendTimeoutCallback_).super__Function_base._M_manager;
    if (p_Var3 != (_Manager_type)0x0) {
      (*p_Var3)((_Any_data *)__x,(_Any_data *)__x,__destroy_functor);
      (this->sendTimeoutCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
      (this->sendTimeoutCallback_)._M_invoker = (_Invoker_type)0x0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::TCPSocket,void>
              ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&cb._M_invoker,
               (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<hwnet::TCPSocket>);
    if (cb.super__Function_base._M_functor._8_8_ == 0) goto LAB_001154fa;
    (*cb.super__Function_base._M_manager)
              ((_Any_data *)local_60,(_Any_data *)&cb._M_invoker,extraout_EDX);
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    std::mutex::lock(&this->mtx);
    if (cb.super__Function_base._M_functor._8_8_ != 0) {
      (*(code *)cb.super__Function_base._M_functor._8_8_)(local_60,local_60,3);
    }
  }
  if (((((this->closed)._M_base._M_i & 1U) == 0) && (this->recvTimeout != 0)) &&
     (((this->recvTimeoutCallback_).super__Function_base._M_manager != (_Manager_type)0x0 &&
      (((this->recvList).
        super__List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>
        ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->recvList &&
       (lVar5 = std::chrono::_V2::steady_clock::now(),
       this->recvTimeout * 1000000 < (ulong)(lVar5 - (this->lastRecvTime).__d.__r))))))) {
    __x_00 = &this->recvTimeoutCallback_;
    std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::function
              ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)local_60,__x_00);
    this->recvTimeout = 0;
    p_Var3 = (this->recvTimeoutCallback_).super__Function_base._M_manager;
    if (p_Var3 != (_Manager_type)0x0) {
      (*p_Var3)((_Any_data *)__x_00,(_Any_data *)__x_00,__destroy_functor);
      (this->recvTimeoutCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
      (this->recvTimeoutCallback_)._M_invoker = (_Invoker_type)0x0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::TCPSocket,void>
              ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&cb._M_invoker,
               (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<hwnet::TCPSocket>);
    if (cb.super__Function_base._M_functor._8_8_ == 0) {
      std::__throw_bad_function_call();
LAB_001154fa:
      uVar6 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar6);
    }
    (*cb.super__Function_base._M_manager)
              ((_Any_data *)local_60,(_Any_data *)&cb._M_invoker,extraout_EDX_00);
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    std::mutex::lock(&this->mtx);
    if (cb.super__Function_base._M_functor._8_8_ != 0) {
      (*(code *)cb.super__Function_base._M_functor._8_8_)(local_60,local_60,3);
    }
  }
  if (this->recvTimeout == 0 && this->sendTimeout == 0) {
    util::Timer::cancel((t->super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr);
    std::__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>);
  }
  return;
}

Assistant:

void TCPSocket::checkTimeout(hwnet::util::Timer::Ptr t) {

	if(t != this->timer.lock()) {
		return;
	}
		
	if(!this->closed && this->sendTimeout > 0 && 
	   this->sendTimeoutCallback_ && !this->ptrSendlist->empty() &&
	   (util::milliseconds)((std::chrono::steady_clock::now() - this->lastSendTime).count()) > this->sendTimeout*1000000) {
		SendTimeoutCallback cb = this->sendTimeoutCallback_;

		this->sendTimeout = 0;
		this->sendTimeoutCallback_ = nullptr;

		this->mtx.unlock();
		cb(shared_from_this());
		this->mtx.lock();
	}

	if(!this->closed && this->recvTimeout > 0 && 
	   this->recvTimeoutCallback_ && !this->recvListEmpty() &&
	   (util::milliseconds)((std::chrono::steady_clock::now() - this->lastRecvTime).count()) > this->recvTimeout*1000000) {
		RecvTimeoutCallback cb = this->recvTimeoutCallback_;
		
		this->recvTimeout = 0;
		this->recvTimeoutCallback_ = nullptr;

		this->mtx.unlock();
		cb(shared_from_this());
		this->mtx.lock();
	}

	if(this->sendTimeout == 0 && this->recvTimeout == 0) {
		t->cancel();
		this->timer.reset();
	}

}